

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O2

void __thiscall
cfd::core::CfdCoreManager::Initialize(CfdCoreManager *this,CfdCoreHandle *handle_address)

{
  int iVar1;
  CfdException *pCVar2;
  allocator local_59;
  int *handle;
  pointer local_50;
  undefined1 local_40 [32];
  
  if (handle_address == (CfdCoreHandle *)0x0) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_40,"cfd::core::Initialize parameter NULL.",(allocator *)&handle);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_40);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (this->finalized_ != true) {
    ::std::mutex::lock(&this->mutex_);
    if ((this->initialized_ == false) &&
       ((this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      InitializeLogger();
      wally_init(0);
      RandomNumberUtil::GetRandomBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&handle,0x20);
      iVar1 = wally_secp_randomize((uchar *)handle,(long)local_50 - (long)handle);
      if (iVar1 != 0) {
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_40,"Failed to secp_randomize error.",&local_59);
        CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_40);
        __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
      this->initialized_ = true;
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&handle);
    }
    handle = (int *)operator_new__(4);
    ::std::vector<int_*,_std::allocator<int_*>_>::push_back(&this->handle_list_,&handle);
    *handle_address = handle;
    local_40._0_8_ = "cfdcore_manager.cpp";
    local_40._8_4_ = 0x60;
    local_40._16_8_ = "Initialize";
    logger::info<void*&>((CfdSourceLocation *)local_40,"core initialize. addr={:p}.",handle_address)
    ;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_40,"cfd::core::Initialize already finalized.",(allocator *)&handle);
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void CfdCoreManager::Initialize(CfdCoreHandle* handle_address) {
  if (handle_address == nullptr) {
    throw CfdException(
        kCfdIllegalArgumentError, "cfd::core::Initialize parameter NULL.");
  }
  if (finalized_) {
    throw CfdException(
        kCfdIllegalStateError, "cfd::core::Initialize already finalized.");
  }

  {
    // Start of exclusive control
    std::lock_guard<std::mutex> lock(mutex_);
    if ((!initialized_) && handle_list_.empty()) {
      // Perform initialization processing.
      InitializeLogger();

      // Since libwally does not produce errors other than its arguments,
      // will only call the function.
      wally_init(0);

      std::vector<uint8_t> data =
          RandomNumberUtil::GetRandomBytes(WALLY_SECP_RANDOMIZE_LEN);
      int wally_ret = wally_secp_randomize(data.data(), data.size());
      if (wally_ret != WALLY_OK) {
        throw CfdException(
            kCfdIllegalStateError, "Failed to secp_randomize error.");
      }
#if 0
      int wally_ret = wally_init(0);
      if (wally_ret != WALLY_OK) {
        throw CfdException(kCfdInternalError,
                           "cfd::core::Initialize parameter NULL.");
      }
#endif

#if 0
      int hidapi_ret = hid_init();
      if (hidapi_ret != 0) {
        error(CFD_LOG_SOURCE, "hid_init error.");
        // TBD:
        // With the error of HIDAPI, should error be ignored?
        // → Pass thru core, check separately the wallet side.
        // throw CfdException(kCfdInternalError, "hid_init error.");
      }
#endif

      initialized_ = true;
    }

    // Generation and registration of handle
    int* handle = new int[1];
    handle_list_.push_back(handle);
    *handle_address = static_cast<void*>(handle);
    info(CFD_LOG_SOURCE, "core initialize. addr={:p}.", *handle_address);
  }
}